

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType)

{
  Which WVar1;
  Data *this_00;
  ArgSlot local_2f;
  RegSlot local_2d;
  undefined1 auStack_29 [2];
  OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  AsmJsRetType retType_local;
  
  local_2f = givenArgCount;
  local_2d = returnValueRegister;
  _auStack_29 = functionRegister;
  layout._3_4_ = retType.which_;
  WVar1 = AsmJsRetType::which((AsmJsRetType *)((long)&layout.Return + 1));
  layout.Return._0_1_ = (undefined1)WVar1;
  this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
  ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(this_00,op,&this->super_ByteCodeWriter,false);
  ByteCodeWriter::Data::Write(this_00,&local_2f,0xb);
  return true;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType)
    {
        OpLayoutT_AsmCall<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::template Assign<int8>(layout.ReturnType, (int8)retType.which()))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }